

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O0

bool __thiscall
Rml::FontProvider::LoadFontFace
          (FontProvider *this,Span<const_unsigned_char> data,int face_index,bool fallback_face,
          UniquePtr<byte[]> *face_memory,String *source,String *font_family,FontStyle style,
          FontWeight weight)

{
  FontWeight FVar1;
  FontStyle style_00;
  undefined2 weight_00;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  pointer pFVar5;
  reference pFVar6;
  FontFaceHandleFreetype in_face;
  ulong uVar7;
  undefined8 uVar8;
  UniquePtr<byte[]> *pUVar9;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  FontWeight local_182;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_138;
  undefined1 local_130 [8];
  String font_face_description;
  FontWeight variation_weight;
  FontFaceHandleFreetype ft_face;
  FaceVariation *variation;
  iterator __end1;
  iterator __begin1;
  Vector<FaceVariation> *__range1;
  iterator iStack_c8;
  int width_distance;
  __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
  local_c0;
  iterator it_best_width;
  int best_width_distance;
  FontWeight current_weight;
  iterator iStack_a8;
  int search_width;
  __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
  local_a0;
  iterator it;
  undefined1 local_90 [8];
  Vector<FaceVariation> load_variations;
  undefined1 local_50 [8];
  Vector<FaceVariation> face_variations;
  UniquePtr<byte[]> *face_memory_local;
  bool fallback_face_local;
  int face_index_local;
  FontProvider *this_local;
  Span<const_unsigned_char> data_local;
  
  iVar3 = (int)source;
  pUVar9 = face_memory;
  face_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)face_memory;
  ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::vector
            ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_50);
  data_00.m_size = (size_t)local_50;
  data_00.m_data = (uchar *)data.m_size;
  bVar2 = FreeType::GetFaceVariations
                    ((FreeType *)data.m_data,data_00,
                     (Vector<FaceVariation> *)(ulong)(uint)face_index,iVar3);
  if (bVar2) {
    ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::vector
              ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_90);
    bVar2 = ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::empty
                      ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_50);
    if (bVar2) {
      it._M_current._0_2_ = 0;
      it._M_current._2_2_ = 0;
      it._M_current._4_4_ = 0;
      ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::push_back
                ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_90,
                 (value_type *)&it);
    }
    else {
      local_a0._M_current =
           (FaceVariation *)
           ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::begin
                     ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_50);
      while( true ) {
        iStack_a8 = ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::end
                              ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)
                               local_50);
        bVar2 = __gnu_cxx::operator!=(&local_a0,&stack0xffffffffffffff58);
        if (!bVar2) break;
        if ((weight == Auto) ||
           (pFVar5 = __gnu_cxx::
                     __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                     ::operator->(&local_a0), pFVar5->weight == weight)) {
          pFVar5 = __gnu_cxx::
                   __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                   ::operator->(&local_a0);
          FVar1 = pFVar5->weight;
          pFVar5 = __gnu_cxx::
                   __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                   ::operator->(&local_a0);
          it_best_width._M_current._4_4_ = Math::Absolute(pFVar5->width - 100);
          local_c0._M_current = local_a0._M_current;
          __gnu_cxx::
          __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
          ::operator++(&local_a0);
          while( true ) {
            iStack_c8 = ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::end
                                  ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>
                                    *)local_50);
            bVar2 = __gnu_cxx::operator!=(&local_a0,&stack0xffffffffffffff38);
            if ((!bVar2) ||
               (pFVar5 = __gnu_cxx::
                         __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                         ::operator->(&local_a0), pFVar5->weight != FVar1)) break;
            pFVar5 = __gnu_cxx::
                     __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                     ::operator->(&local_a0);
            iVar3 = Math::Absolute(pFVar5->width - 100);
            if (iVar3 < it_best_width._M_current._4_4_) {
              local_c0._M_current = local_a0._M_current;
              it_best_width._M_current._4_4_ = iVar3;
            }
            __gnu_cxx::
            __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
            ::operator++(&local_a0);
          }
          pFVar6 = __gnu_cxx::
                   __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                   ::operator*(&local_c0);
          ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::push_back
                    ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_90,
                     pFVar6);
        }
        else {
          __gnu_cxx::
          __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
          ::operator++(&local_a0);
        }
      }
    }
    bVar2 = ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::empty
                      ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_90);
    if (bVar2) {
      uVar4 = ::std::__cxx11::string::c_str();
      Log::Message(LT_ERROR,
                   "Failed to load font face from \'%s\': Could not locate face with weight %d.",
                   uVar4,(ulong)weight);
      data_local.m_size._7_1_ = 0;
      load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      __end1 = ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::begin
                         ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)
                          local_90);
      variation = (FaceVariation *)
                  ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::end
                            ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)
                             local_90);
      while( true ) {
        iVar3 = (int)pUVar9;
        bVar2 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                                    *)&variation);
        if (!bVar2) break;
        pFVar6 = __gnu_cxx::
                 __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
                 ::operator*(&__end1);
        data_01.m_size = (size_t)source;
        data_01.m_data = (uchar *)data.m_size;
        in_face = FreeType::LoadFace((FreeType *)data.m_data,data_01,
                                     (String *)(ulong)(uint)face_index,pFVar6->named_instance_index,
                                     iVar3);
        if (in_face == 0) {
          data_local.m_size._7_1_ = 0;
          load_variations.
          super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          goto LAB_0070338b;
        }
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          FreeType::GetFaceStyle(in_face,font_family,&style,(FontWeight *)0x0);
        }
        if (weight == Auto) {
          FreeType::GetFaceStyle(in_face,(String *)0x0,(FontStyle *)0x0,&weight);
        }
        if (pFVar6->weight == Auto) {
          local_182 = weight;
        }
        else {
          local_182 = pFVar6->weight;
        }
        font_face_description.field_2._14_2_ = local_182;
        GetFontFaceDescription((String *)local_130,font_family,style,local_182);
        weight_00 = font_face_description.field_2._14_2_;
        style_00 = style;
        ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
                  (&local_138,face_memory);
        pUVar9 = (UniquePtr<byte[]> *)(ulong)(fallback_face & 1);
        bVar2 = AddFace(this,in_face,font_family,style_00,weight_00,SUB41(fallback_face & 1,0),
                        &local_138);
        ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  (&local_138);
        bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
        if (bVar2) {
          uVar4 = ::std::__cxx11::string::c_str();
          uVar8 = ::std::__cxx11::string::c_str();
          Log::Message(LT_ERROR,"Failed to load font face %s from \'%s\'.",uVar4,uVar8);
          data_local.m_size._7_1_ = 0;
        }
        else {
          uVar4 = ::std::__cxx11::string::c_str();
          uVar8 = ::std::__cxx11::string::c_str();
          Log::Message(LT_INFO,"Loaded font face %s from \'%s\'.",uVar4,uVar8);
        }
        load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
        load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar2;
        ::std::__cxx11::string::~string((string *)local_130);
        if ((uint)load_variations.
                  super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0070338b;
        __gnu_cxx::
        __normal_iterator<Rml::FaceVariation_*,_std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>_>
        ::operator++(&__end1);
      }
      data_local.m_size._7_1_ = 1;
      load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
LAB_0070338b:
    ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::~vector
              ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_90);
  }
  else {
    uVar4 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,
                 "Failed to load font face from \'%s\': Invalid or unsupported font face file format."
                 ,uVar4);
    data_local.m_size._7_1_ = 0;
    load_variations.super__Vector_base<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  ::std::vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_>::~vector
            ((vector<Rml::FaceVariation,_std::allocator<Rml::FaceVariation>_> *)local_50);
  return (bool)(data_local.m_size._7_1_ & 1);
}

Assistant:

bool FontProvider::LoadFontFace(Span<const byte> data, int face_index, bool fallback_face, UniquePtr<byte[]> face_memory, const String& source, String font_family,
	Style::FontStyle style, Style::FontWeight weight)
{
	using Style::FontWeight;

	Vector<FaceVariation> face_variations;
	if (!FreeType::GetFaceVariations(data, face_variations, face_index))
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Invalid or unsupported font face file format.", source.c_str());
		return false;
	}

	Vector<FaceVariation> load_variations;
	if (face_variations.empty())
	{
		load_variations.push_back(FaceVariation{Style::FontWeight::Auto, 0, 0});
	}
	else
	{
		// Iterate through all the face variations and pick the ones to load. The list is already sorted by (weight, width). When weight is set to
		// 'auto' we load all the weights of the face. However, we only want to load one width for each weight.
		for (auto it = face_variations.begin(); it != face_variations.end();)
		{
			if (weight != FontWeight::Auto && it->weight != weight)
			{
				++it;
				continue;
			}

			// We don't currently have any way for users to select widths, so we search for a regular (medium) value here.
			constexpr int search_width = 100;
			const FontWeight current_weight = it->weight;

			int best_width_distance = Math::Absolute((int)it->width - search_width);
			auto it_best_width = it;

			// Search forward to find the best 'width' with the same weight.
			for (++it; it != face_variations.end(); ++it)
			{
				if (it->weight != current_weight)
					break;

				const int width_distance = Math::Absolute((int)it->width - search_width);
				if (width_distance < best_width_distance)
				{
					best_width_distance = width_distance;
					it_best_width = it;
				}
			}

			load_variations.push_back(*it_best_width);
		}
	}

	if (load_variations.empty())
	{
		Log::Message(Log::LT_ERROR, "Failed to load font face from '%s': Could not locate face with weight %d.", source.c_str(), (int)weight);
		return false;
	}

	for (const FaceVariation& variation : load_variations)
	{
		FontFaceHandleFreetype ft_face = FreeType::LoadFace(data, source, face_index, variation.named_instance_index);
		if (!ft_face)
			return false;

		if (font_family.empty())
			FreeType::GetFaceStyle(ft_face, &font_family, &style, nullptr);
		if (weight == FontWeight::Auto)
			FreeType::GetFaceStyle(ft_face, nullptr, nullptr, &weight);

		const FontWeight variation_weight = (variation.weight == FontWeight::Auto ? weight : variation.weight);
		const String font_face_description = GetFontFaceDescription(font_family, style, variation_weight);

		if (!AddFace(ft_face, font_family, style, variation_weight, fallback_face, std::move(face_memory)))
		{
			Log::Message(Log::LT_ERROR, "Failed to load font face %s from '%s'.", font_face_description.c_str(), source.c_str());
			return false;
		}

		Log::Message(Log::LT_INFO, "Loaded font face %s from '%s'.", font_face_description.c_str(), source.c_str());
	}

	return true;
}